

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBad.cpp
# Opt level: O3

void __thiscall L12_1::StringBad::~StringBad(StringBad *this)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
  __s = this->str;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1362e0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\" object deleted. ",0x12);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,num_strings + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," left.\n",7);
  num_strings = num_strings + -1;
  if (this->str != (char *)0x0) {
    operator_delete__(this->str);
  }
  return;
}

Assistant:

StringBad::~StringBad() {
        std::cout << "\"" << str << "\" object deleted. " << num_strings - 1 << " left.\n";
        num_strings--;
        //  清掉动态分配的内存
        delete [] str;
    }